

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofSpringConstraint::init(btGeneric6DofSpringConstraint *this,EVP_PKEY_CTX *ctx)

{
  btGeneric6DofSpringConstraint *pbVar1;
  int i;
  btGeneric6DofSpringConstraint *this_local;
  
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint.super_btTypedObject.m_objectType = 9
  ;
  i = 0;
  pbVar1 = this;
  while (i < 6) {
    *(undefined1 *)((long)this->m_equilibriumPoint + (long)i + -7) = 0;
    this->m_equilibriumPoint[i] = 0.0;
    this->m_springStiffness[i] = 0.0;
    this->m_springDamping[i] = 1.0;
    i = i + 1;
    pbVar1 = (btGeneric6DofSpringConstraint *)(ulong)(uint)i;
  }
  return (int)pbVar1;
}

Assistant:

void btGeneric6DofSpringConstraint::init()
{
	m_objectType = D6_SPRING_CONSTRAINT_TYPE;

	for(int i = 0; i < 6; i++)
	{
		m_springEnabled[i] = false;
		m_equilibriumPoint[i] = btScalar(0.f);
		m_springStiffness[i] = btScalar(0.f);
		m_springDamping[i] = btScalar(1.f);
	}
}